

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

bool amrex::ParmParse::QueryUnusedInputs(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  string local_30;
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    paVar1 = &local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_30._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = unused_table_entries_q((Table *)&(anonymous_namespace)::g_table_abi_cxx11_,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                               local_30.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      finalize_verbose = system::verbose != 0;
      if ((bool)finalize_verbose) {
        poVar3 = OutStream();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Unused ParmParse Variables:\n",0x1c);
      }
      local_30._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"  [TOP]","");
      finalize_table(&local_30,(Table *)&(anonymous_namespace)::g_table_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != paVar1) {
        operator_delete(local_30._M_dataplus._M_p,
                        CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                                 local_30.field_2._M_local_buf[0]) + 1);
      }
      if (finalize_verbose != '\x01') {
        return true;
      }
      poVar3 = OutStream();
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      return true;
    }
  }
  return false;
}

Assistant:

ParmParse::Frame::Frame (ParmParse& pp, const std::string& pfix)
    :
    m_pp(pp), m_np(0)
{
    push(pfix);
    BL_ASSERT( m_np == 1 );
}